

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O0

float __thiscall
squaredloss::getLoss(squaredloss *this,shared_data *sd,float prediction,float label)

{
  float example_loss;
  float label_local;
  float prediction_local;
  shared_data *sd_local;
  squaredloss *this_local;
  float local_4;
  
  if ((sd->max_label < prediction) || (prediction < sd->min_label)) {
    if (sd->min_label <= prediction) {
      if ((label != sd->max_label) || (NAN(label) || NAN(sd->max_label))) {
        local_4 = (sd->max_label - label) * 2.0 * (prediction - sd->max_label) +
                  (sd->max_label - label) * (sd->max_label - label);
      }
      else {
        local_4 = 0.0;
      }
    }
    else if ((label != sd->min_label) || (NAN(label) || NAN(sd->min_label))) {
      local_4 = (label - sd->min_label) * 2.0 * (sd->min_label - prediction) +
                (label - sd->min_label) * (label - sd->min_label);
    }
    else {
      local_4 = 0.0;
    }
  }
  else {
    local_4 = (prediction - label) * (prediction - label);
  }
  return local_4;
}

Assistant:

float getLoss(shared_data* sd, float prediction, float label)
  {
    if (prediction <= sd->max_label && prediction >= sd->min_label)
    {
      float example_loss = (prediction - label) * (prediction - label);
      return example_loss;
    }
    else if (prediction < sd->min_label)
      if (label == sd->min_label)
        return 0.;
      else
        return (float)((label - sd->min_label) * (label - sd->min_label) +
            2. * (label - sd->min_label) * (sd->min_label - prediction));
    else if (label == sd->max_label)
      return 0.;
    else
      return float((sd->max_label - label) * (sd->max_label - label) +
          2. * (sd->max_label - label) * (prediction - sd->max_label));
  }